

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

KeyInfo * InterpretKey(string *key)

{
  byte bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  KeyInfo *in_RDI;
  long in_FS_OFFSET;
  size_t option_index;
  KeyInfo *result;
  KeyInfo *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  KeyInfo *this;
  size_type in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  KeyInfo *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  this = in_RDI;
  pbVar4 = in_RSI;
  __str = in_RDI;
  KeyInfo::KeyInfo(in_stack_ffffffffffffff58);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar3,in_stack_ffffffffffffffa0),(char)((ulong)pbVar4 >> 0x38),
                     in_stack_ffffffffffffff98);
  if (sVar2 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_RSI,(size_type)this,(size_type)in_RDI);
    in_stack_ffffffffffffff68 = &local_28;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffb8,&__str->name);
    std::__cxx11::string::~string(&in_stack_ffffffffffffff58->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&this->name,(size_type)in_RDI,(size_type)in_stack_ffffffffffffff68);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_RSI,(size_type)this,(size_type)in_RDI);
  bVar1 = std::operator==(in_stack_ffffffffffffff68,
                          (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  std::__cxx11::string::~string(&in_stack_ffffffffffffff58->name);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&this->name,(size_type)in_RDI,(size_type)in_stack_ffffffffffffff68);
    in_RDI->negated = true;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffff68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

KeyInfo InterpretKey(std::string key)
{
    KeyInfo result;
    // Split section name from key name for keys like "testnet.foo" or "regtest.bar"
    size_t option_index = key.find('.');
    if (option_index != std::string::npos) {
        result.section = key.substr(0, option_index);
        key.erase(0, option_index + 1);
    }
    if (key.substr(0, 2) == "no") {
        key.erase(0, 2);
        result.negated = true;
    }
    result.name = key;
    return result;
}